

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v11::detail::write_loc(appender out,loc_value value,format_specs *specs,locale_ref loc)

{
  bool bVar1;
  format_facet<std::locale> *in_stack_00000010;
  format_facet<std::locale> *in_stack_00000018;
  appender in_stack_00000020;
  locale locale;
  locale_ref *in_stack_fffffffffffffec8;
  locale *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  format_specs *in_stack_ffffffffffffff00;
  format_facet<std::locale> *in_stack_ffffffffffffff08;
  appender in_stack_ffffffffffffff10;
  basic_format_arg<fmt::v11::context> in_stack_ffffffffffffff20;
  locale *in_stack_ffffffffffffff48;
  format_facet<std::locale> *in_stack_ffffffffffffff50;
  locale local_28 [39];
  byte local_1;
  
  locale_ref::get<std::locale>(in_stack_fffffffffffffec8);
  bVar1 = std::has_facet<fmt::v11::format_facet<std::locale>>
                    ((locale *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
  if (bVar1) {
    std::use_facet<fmt::v11::format_facet<std::locale>>(in_stack_fffffffffffffed0);
    local_1 = format_facet<std::locale>::put
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                         (loc_value)in_stack_ffffffffffffff20,in_stack_ffffffffffffff00);
  }
  else {
    format_facet<std::locale>::format_facet(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_1 = format_facet<std::locale>::put
                        (in_stack_00000018,in_stack_00000020,(loc_value)in_stack_ffffffffffffff20,
                         (format_specs *)in_stack_00000010);
    format_facet<std::locale>::~format_facet(in_stack_00000010);
  }
  std::locale::~locale(local_28);
  return (bool)(local_1 & 1);
}

Assistant:

FMT_FUNC auto write_loc(appender out, loc_value value,
                        const format_specs& specs, locale_ref loc) -> bool {
  auto locale = loc.get<std::locale>();
  // We cannot use the num_put<char> facet because it may produce output in
  // a wrong encoding.
  using facet = format_facet<std::locale>;
  if (std::has_facet<facet>(locale))
    return use_facet<facet>(locale).put(out, value, specs);
  return facet(locale).put(out, value, specs);
}